

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseStructStmt(Parser *this)

{
  char *pcVar1;
  TokenType TVar2;
  pointer pcVar3;
  _Head_base<0UL,_enact::Stmt_*,_false> _Var4;
  _func_int **pp_Var5;
  Parser *in_RSI;
  Token fieldName;
  Token name;
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> fields;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  line_t local_c8;
  col_t local_c4;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_c0;
  undefined1 local_b8 [16];
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _func_int *p_Stack_90;
  line_t local_88;
  col_t local_84;
  _Head_base<0UL,_enact::Stmt_*,_false> local_80;
  TokenType local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  line_t local_50;
  col_t local_4c;
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> local_48;
  
  local_f0 = (undefined1  [8])local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Expected struct name.","");
  expect(in_RSI,IDENTIFIER,(string *)local_f0);
  if (local_f0 != (undefined1  [8])local_e0) {
    operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
  }
  local_78 = (in_RSI->m_previous).type;
  local_70._M_p = (pointer)&local_60;
  pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
  local_4c = (in_RSI->m_previous).col;
  local_50 = (in_RSI->m_previous).line;
  local_f0 = (undefined1  [8])local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Expected \'{\' before struct body.","");
  expect(in_RSI,LEFT_BRACE,(string *)local_f0);
  local_80._M_head_impl = (Stmt *)this;
  if (local_f0 != (undefined1  [8])local_e0) {
    operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
  }
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_a0._M_local_buf + 8;
  while ((TVar2 = (in_RSI->m_current).type, TVar2 != RIGHT_BRACE && (TVar2 != END_OF_FILE))) {
    local_f0 = (undefined1  [8])local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected field declaration in struct body.","");
    expect(in_RSI,IDENTIFIER,(string *)local_f0);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
    }
    local_b8._8_4_ = (in_RSI->m_previous).type;
    pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_a8 = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
    local_84 = (in_RSI->m_previous).col;
    local_88 = (in_RSI->m_previous).line;
    local_f0 = (undefined1  [8])local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected field typename.","");
    expectTypenamePrecFunction((Parser *)local_b8,(string *)in_RSI,SUB81((Field *)local_f0,0));
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
    }
    local_f0._0_4_ = local_b8._8_4_;
    local_e8._M_p = local_e0 + 8;
    if (local_a8 == pcVar1) {
      local_d8._8_8_ = p_Stack_90;
    }
    else {
      local_e8._M_p = local_a8;
    }
    local_d8._1_7_ = local_a0._9_7_;
    local_d8._M_local_buf[0] = local_a0._M_local_buf[8];
    local_e0 = (undefined1  [8])local_a0._M_allocated_capacity;
    local_a0._M_allocated_capacity = 0;
    local_a0._M_local_buf[8] = '\0';
    local_c4 = local_84;
    local_c8 = local_88;
    local_c0._M_head_impl = (Typename *)local_b8._0_8_;
    local_b8._0_8_ = (CompileContext *)0x0;
    local_a8 = pcVar1;
    std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::
    emplace_back<enact::StructStmt::Field>(&local_48,(Field *)local_f0);
    if ((_Head_base<0UL,_const_enact::Typename_*,_false>)local_c0._M_head_impl !=
        (_Head_base<0UL,_const_enact::Typename_*,_false>)0x0) {
      (*(local_c0._M_head_impl)->_vptr_Typename[1])();
    }
    local_c0._M_head_impl = (Typename *)0x0;
    if (local_e8._M_p != local_e0 + 8) {
      operator_delete(local_e8._M_p,(ulong)(local_d8._0_8_ + 1));
    }
    local_f0 = (undefined1  [8])local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected \';\' after struct field declaration.","");
    expect(in_RSI,SEMICOLON,(string *)local_f0);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
    }
    if ((CompileContext *)local_b8._0_8_ != (CompileContext *)0x0) {
      (**(_func_int **)((long)(((string *)local_b8._0_8_)->_M_dataplus)._M_p + 8))();
    }
    if (local_a8 != pcVar1) {
      operator_delete(local_a8,CONCAT71(local_a0._9_7_,local_a0._M_local_buf[8]) + 1);
    }
  }
  local_f0 = (undefined1  [8])local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Expected \'}\' after struct body.","");
  expect(in_RSI,RIGHT_BRACE,(string *)local_f0);
  if (local_f0 != (undefined1  [8])local_e0) {
    operator_delete((void *)local_f0,(ulong)((long)local_e0 + 1));
  }
  pp_Var5 = (_func_int **)operator_new(0x50);
  local_f0._0_4_ = local_78;
  local_e8._M_p = local_e0 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_70._M_p,local_70._M_p + local_68);
  _Var4._M_head_impl = local_80._M_head_impl;
  *pp_Var5 = (_func_int *)&PTR__StructStmt_00127008;
  *(undefined4 *)(pp_Var5 + 1) = local_f0._0_4_;
  pp_Var5[2] = (_func_int *)(pp_Var5 + 4);
  if (local_e8._M_p == local_e0 + 8) {
    pp_Var5[4] = (_func_int *)local_d8._0_8_;
    pp_Var5[5] = (_func_int *)local_d8._8_8_;
  }
  else {
    pp_Var5[2] = (_func_int *)local_e8._M_p;
    pp_Var5[4] = (_func_int *)local_d8._0_8_;
  }
  pp_Var5[3] = (_func_int *)local_e0;
  *(line_t *)(pp_Var5 + 6) = local_50;
  *(col_t *)((long)pp_Var5 + 0x34) = local_4c;
  pp_Var5[7] = (_func_int *)
               local_48.
               super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pp_Var5[8] = (_func_int *)
               local_48.
               super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var5[9] = (_func_int *)
               local_48.
               super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80._M_head_impl)->_vptr_Stmt = pp_Var5;
  std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::~vector
            (&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         _Var4._M_head_impl;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseStructStmt() {
        expect(TokenType::IDENTIFIER, "Expected struct name.");
        Token name = m_previous;

        expect(TokenType::LEFT_BRACE, "Expected '{' before struct body.");

        std::vector<StructStmt::Field> fields;

        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            expect(TokenType::IDENTIFIER, "Expected field declaration in struct body.");
            // Field declaration
            Token fieldName = m_previous;
            std::unique_ptr<const Typename> fieldType = expectTypename("Expected field typename.");

            fields.push_back(StructStmt::Field{std::move(fieldName), std::move(fieldType)});

            expect(TokenType::SEMICOLON, "Expected ';' after struct field declaration.");
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after struct body.");

        return std::make_unique<StructStmt>(name, std::move(fields));
    }